

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectricityBill.cpp
# Opt level: O0

void __thiscall ElectricityBill::QueryBill(ElectricityBill *this,Timer *timer)

{
  bool bVar1;
  LogLevel LVar2;
  reference room_info_00;
  Logger *pLVar3;
  Logger local_8740;
  string local_8528;
  Logger local_8508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_82f0;
  undefined1 local_82d0 [8];
  string result;
  FileForAppend file;
  string room_file_path;
  RoomInfo *room_info;
  iterator __end1;
  iterator __begin1;
  vector<RoomInfo,_std::allocator<RoomInfo>_> *__range1;
  Logger local_230;
  Timer *local_18;
  Timer *timer_local;
  ElectricityBill *this_local;
  
  local_18 = timer;
  timer_local = (Timer *)this;
  LVar2 = higan::Logger::GetLogLevel();
  if ((int)LVar2 < 2) {
    higan::Logger::Logger
              (&local_230,INFO,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/example/ElectricityBill/ElectricityBill.cpp"
               ,0x84,"QueryBill");
    higan::Logger::operator<<(&local_230,"----------Query Bill Start------------");
    higan::Logger::~Logger(&local_230);
  }
  __end1 = std::vector<RoomInfo,_std::allocator<RoomInfo>_>::begin(&this->room_informations_);
  room_info = (RoomInfo *)
              std::vector<RoomInfo,_std::allocator<RoomInfo>_>::end(&this->room_informations_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<RoomInfo_*,_std::vector<RoomInfo,_std::allocator<RoomInfo>_>_>
                                *)&room_info);
    if (!bVar1) break;
    room_info_00 = __gnu_cxx::
                   __normal_iterator<RoomInfo_*,_std::vector<RoomInfo,_std::allocator<RoomInfo>_>_>
                   ::operator*(&__end1);
    GetRoomFilePathInternal_abi_cxx11_((string *)&file.write_sum_bytes_,this,room_info_00);
    higan::FileForAppend::FileForAppend
              ((FileForAppend *)((long)&result.field_2 + 8),(string *)&file.write_sum_bytes_);
    DoQuery_abi_cxx11_((string *)local_82d0,this,room_info_00);
    std::operator+(&local_82f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_82d0,
                   '\n');
    higan::FileForAppend::Append((FileForAppend *)((long)&result.field_2 + 8),&local_82f0);
    std::__cxx11::string::~string((string *)&local_82f0);
    LVar2 = higan::Logger::GetLogLevel();
    if ((int)LVar2 < 2) {
      higan::Logger::Logger
                (&local_8508,INFO,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/example/ElectricityBill/ElectricityBill.cpp"
                 ,0x8e,"QueryBill");
      pLVar3 = higan::Logger::operator<<(&local_8508,"Query Result: ");
      RoomInfo::GetRoomInfoString_abi_cxx11_(&local_8528,room_info_00);
      pLVar3 = higan::Logger::operator<<(pLVar3,&local_8528);
      pLVar3 = higan::Logger::operator<<(pLVar3," ");
      higan::Logger::operator<<(pLVar3,(string *)local_82d0);
      std::__cxx11::string::~string((string *)&local_8528);
      higan::Logger::~Logger(&local_8508);
    }
    std::__cxx11::string::~string((string *)local_82d0);
    higan::FileForAppend::~FileForAppend((FileForAppend *)((long)&result.field_2 + 8));
    std::__cxx11::string::~string((string *)&file.write_sum_bytes_);
    __gnu_cxx::__normal_iterator<RoomInfo_*,_std::vector<RoomInfo,_std::allocator<RoomInfo>_>_>::
    operator++(&__end1);
  }
  LVar2 = higan::Logger::GetLogLevel();
  if ((int)LVar2 < 2) {
    higan::Logger::Logger
              (&local_8740,INFO,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/example/ElectricityBill/ElectricityBill.cpp"
               ,0x91,"QueryBill");
    higan::Logger::operator<<(&local_8740,"----------Query Bill End------------");
    higan::Logger::~Logger(&local_8740);
  }
  return;
}

Assistant:

void ElectricityBill::QueryBill(const higan::Timer& timer)
{
	LOG_INFO << "----------Query Bill Start------------";

	for (const auto & room_info : room_informations_)
	{
		std::string room_file_path = GetRoomFilePathInternal(room_info);

		higan::FileForAppend file(room_file_path);
		std::string result =  DoQuery(room_info);

		file.Append(result + '\n');
		LOG_INFO << "Query Result: " << room_info.GetRoomInfoString() << " " << result;
	}

	LOG_INFO << "----------Query Bill End------------";
}